

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

void CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::TableStruct::Shutdown
               (void)

{
  if (DAT_003cb7b0 == '\x01') {
    DAT_003cb7b0 = '\0';
    (*(code *)*_VisionFeaturePrint_Scene_default_instance_)();
  }
  if (DAT_003cb7e8 == '\x01') {
    DAT_003cb7e8 = '\0';
    (*(code *)*_VisionFeaturePrint_Objects_default_instance_)();
  }
  if (DAT_003cb810 == '\x01') {
    DAT_003cb810 = 0;
    (*(code *)*_VisionFeaturePrint_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _VisionFeaturePrint_Scene_default_instance_.Shutdown();
  _VisionFeaturePrint_Objects_default_instance_.Shutdown();
  _VisionFeaturePrint_default_instance_.Shutdown();
}